

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

BailOutInstrTemplate<IR::BranchInstr> *
IR::BailOutInstrTemplate<IR::BranchInstr>::New
          (OpCode opcode,BailOutKind kind,BailOutInfo *bailOutInfo,Func *func)

{
  Instr *this;
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  BailOutInstrTemplate<IR::BranchInstr> *this_00;
  
  if (bailOutInfo->bailOutFunc != func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5c0,"(func == bailOutInfo->bailOutFunc)",
                       "func == bailOutInfo->bailOutFunc");
    if (!bVar2) goto LAB_004be286;
    *puVar4 = 0;
  }
  bVar2 = IsValidBailOutKindAndBits(kind);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5c1,"(IsValidBailOutKindAndBits(kind))","IsValidBailOutKindAndBits(kind)")
    ;
    if (!bVar2) {
LAB_004be286:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = (BailOutInstrTemplate<IR::BranchInstr> *)
            new<Memory::JitArenaAllocator>(0x88,func->m_alloc,0x3eba5c);
  BailOutInstrTemplate(this_00);
  Instr::Init((Instr *)this_00,opcode,InstrKindBranch,func);
  bailOutInfo->bailOutOpcode = opcode;
  this_00->bailOutInfo = bailOutInfo;
  this_00->bailOutKind = kind;
  this_00->auxBailOutKind = BailOutInvalid;
  this = bailOutInfo->bailOutInstr;
  if (this == (Instr *)0x0) {
    bailOutInfo->bailOutInstr = (Instr *)this_00;
  }
  else if (bailOutInfo->sharedBailOutKind == true) {
    if ((this->field_0x38 & 0x10) == 0) {
      bailOutInfo->sharedBailOutKind = false;
    }
    else {
      BVar3 = Instr::GetBailOutKind(this);
      bailOutInfo->sharedBailOutKind = BVar3 == kind;
    }
  }
  func->field_0x240 = func->field_0x240 | 0x10;
  JITOutput::SetHasBailoutInstr(&func->m_output,true);
  return this_00;
}

Assistant:

BailOutInstrTemplate<InstrType> *
BailOutInstrTemplate<InstrType>::New(Js::OpCode opcode, BailOutKind kind, BailOutInfo * bailOutInfo, Func * func)
{
    Assert(func == bailOutInfo->bailOutFunc);
    Assert(IsValidBailOutKindAndBits(kind));
    BailOutInstrTemplate * bailOutInstr = JitAnew(func->m_alloc, BailOutInstrTemplate);
    bailOutInstr->Init(opcode, IRKindMap<InstrType>::InstrKind, func);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutInfo->bailOutOpcode = opcode;
#endif
    bailOutInstr->bailOutInfo = bailOutInfo;
    bailOutInstr->bailOutKind = kind;
    bailOutInstr->auxBailOutKind = BailOutInvalid;

    if (bailOutInfo->bailOutInstr == nullptr)
    {
        bailOutInfo->bailOutInstr = bailOutInstr;
    }
    else if (bailOutInfo->sharedBailOutKind)
    {
        if (bailOutInfo->bailOutInstr->HasBailOutInfo())
        {
            bailOutInfo->sharedBailOutKind = bailOutInfo->bailOutInstr->GetBailOutKind() ==  kind;
        }
        else
        {
            // Rare cases where we have already generated the bailout record. Unlikely they share the same bailout kind as this is hit only when we try to
            // share bailout in lowerer. See Instr::ShareBailOut.
            bailOutInfo->sharedBailOutKind = false;
        }
    }

    func->hasBailout = true;

    // Indicate that the function has bailout instructions
    // This information is used to determine whether to free jitted loop bodies
    // If the function has bailout instructions, we keep the loop bodies alive
    // in case we bail out to the interpreter, so that we can reuse the jitted
    // loop bodies
    func->GetJITOutput()->SetHasBailoutInstr(true);

    return bailOutInstr;
}